

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O0

int crnlib::LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int __result__;
  UInt32 rem;
  SizeT limit2;
  Byte *bufLimit_local;
  SizeT limit_local;
  CLzmaDec *p_local;
  
  while( true ) {
    ___result__ = limit;
    if ((p->checkDicSize == 0) &&
       (uVar1 = (p->prop).dicSize - p->processedPos, (ulong)uVar1 < limit - p->dicPos)) {
      ___result__ = p->dicPos + (ulong)uVar1;
    }
    iVar2 = LzmaDec_DecodeReal(p,___result__,bufLimit);
    if (iVar2 != 0) break;
    if ((p->prop).dicSize <= p->processedPos) {
      p->checkDicSize = (p->prop).dicSize;
    }
    LzmaDec_WriteRem(p,limit);
    bVar3 = false;
    if ((p->dicPos < limit) && (bVar3 = false, p->buf < bufLimit)) {
      bVar3 = p->remainLen < 0x112;
    }
    if (!bVar3) {
      if (0x112 < p->remainLen) {
        p->remainLen = 0x112;
      }
      return 0;
    }
  }
  return iVar2;
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec* p, SizeT limit, const Byte* bufLimit) {
  do {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0) {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    if (p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    LzmaDec_WriteRem(p, limit);
  } while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart) {
    p->remainLen = kMatchSpecLenStart;
  }
  return 0;
}